

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O1

void __thiscall FIWadManager::ParseIWadInfos(FIWadManager *this,char *fn)

{
  int iVar1;
  FResourceFile *pFVar2;
  undefined4 extraout_var;
  char *data;
  DWORD DVar3;
  char *fn_00;
  FResourceLump *this_00;
  
  pFVar2 = FResourceFile::OpenResourceFile(fn,(FileReader *)0x0,true,false);
  if (pFVar2 != (FResourceFile *)0x0) {
    DVar3 = pFVar2->NumLumps;
    if (-1 < (int)(DVar3 - 1)) {
      do {
        DVar3 = DVar3 - 1;
        iVar1 = (*pFVar2->_vptr_FResourceFile[4])(pFVar2,(ulong)DVar3);
        this_00 = (FResourceLump *)CONCAT44(extraout_var,iVar1);
        if (this_00->Namespace == 0) {
          fn_00 = "IWADINFO";
          iVar1 = strcasecmp((this_00->field_3).Name,"IWADINFO");
          if (iVar1 == 0) {
            data = (char *)FResourceLump::CacheLump(this_00);
            ParseIWadInfo(this,fn_00,data,this_00->LumpSize);
            break;
          }
        }
      } while (0 < (int)DVar3);
    }
    (*pFVar2->_vptr_FResourceFile[1])(pFVar2);
  }
  if (((this->mIWadNames).Count != 0) && ((this->mIWads).Count != 0)) {
    return;
  }
  I_FatalError("No IWAD definitions found");
  return;
}

Assistant:

void FIWadManager::ParseIWadInfos(const char *fn)
{
	FResourceFile *resfile = FResourceFile::OpenResourceFile(fn, NULL, true);
	if (resfile != NULL)
	{
		DWORD cnt = resfile->LumpCount();
		for(int i=cnt-1; i>=0; i--)
		{
			FResourceLump *lmp = resfile->GetLump(i);

			if (lmp->Namespace == ns_global && !stricmp(lmp->Name, "IWADINFO"))
			{
				// Found one!
				ParseIWadInfo(resfile->Filename, (const char*)lmp->CacheLump(), lmp->LumpSize);
				break;
			}
		}
		delete resfile;
	}
	if (mIWadNames.Size() == 0 || mIWads.Size() == 0)
	{
		I_FatalError("No IWAD definitions found");
	}
}